

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O0

void ELFIO::adjust_stream_size(ostream *stream,streamsize offset)

{
  streamsize sVar1;
  streamsize sVar2;
  streamoff sVar3;
  long lVar4;
  undefined1 auVar5 [16];
  fpos<__mbstate_t> local_88 [2];
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [16];
  size_type local_30;
  streamsize size;
  undefined8 local_20;
  streamsize local_18;
  streamsize offset_local;
  ostream *stream_local;
  
  local_18 = offset;
  offset_local = (streamsize)stream;
  std::ostream::seekp((long)stream,_S_beg);
  auVar5 = std::ostream::tellp();
  local_20 = auVar5._8_8_;
  size = auVar5._0_8_;
  sVar3 = std::fpos::operator_cast_to_long((fpos *)&size);
  sVar1 = local_18;
  if (sVar3 < local_18) {
    local_40 = std::ostream::tellp();
    sVar3 = std::fpos::operator_cast_to_long((fpos *)local_40);
    sVar2 = offset_local;
    local_30 = sVar1 - sVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,sVar1 - sVar3,'\0',&local_61);
    lVar4 = std::__cxx11::string::c_str();
    std::ostream::write((char *)sVar2,lVar4);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  sVar1 = offset_local;
  std::fpos<__mbstate_t>::fpos(local_88,local_18);
  std::ostream::seekp(sVar1,local_88[0]._M_off,local_88[0]._M_state);
  return;
}

Assistant:

inline void adjust_stream_size( std::ostream& stream, std::streamsize offset )
{
    stream.seekp( 0, std::ios_base::end );
    if ( stream.tellp() < offset ) {
        std::streamsize size = offset - stream.tellp();
        stream.write( std::string( size_t( size ), '\0' ).c_str(), size );
    }
    stream.seekp( offset );
}